

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

void __thiscall lest::confirm::~confirm(confirm *this)

{
  pointer pcVar1;
  ostream *poVar2;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [16];
  char *local_110;
  long local_108;
  char local_100 [16];
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  text local_d0;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  text local_70;
  text local_50;
  
  if (this->failures < 1) {
    if ((this->output).opt.pass != true) goto LAB_00105549;
    poVar2 = (this->super_action).os;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"All ",4);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->selected);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," selected ",10);
    local_f0 = local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"test","");
    paVar4 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_f0,local_f0 + local_e8);
    pluralise(&local_d0,&local_70,this->selected);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    local_130 = local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"passed.\n","");
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_130,local_130 + local_128);
    local_110 = local_100;
    std::__cxx11::string::_M_construct<char*>((string *)&local_110,local_b0,local_b0 + local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_110,local_108);
    if (local_110 != local_100) {
      operator_delete(local_110);
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0);
    }
    if (local_130 != local_120) {
      operator_delete(local_130);
    }
    _Var3._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
      _Var3._M_p = local_70._M_dataplus._M_p;
    }
  }
  else {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)(this->super_action).os,this->failures);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," out of ",8);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->selected);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," selected ",10);
    local_f0 = local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"test","");
    paVar4 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_f0,local_f0 + local_e8);
    pluralise(&local_d0,&local_50,this->selected);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    local_130 = local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"failed.\n","");
    local_90 = local_80;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_130,local_130 + local_128);
    local_110 = local_100;
    std::__cxx11::string::_M_construct<char*>((string *)&local_110,local_90,local_90 + local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_110,local_108);
    if (local_110 != local_100) {
      operator_delete(local_110);
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    if (local_130 != local_120) {
      operator_delete(local_130);
    }
    _Var3._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
      _Var3._M_p = local_50._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar4) {
    operator_delete(_Var3._M_p);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
LAB_00105549:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->output).ctx);
  pcVar1 = (this->output).testing._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->output).testing.field_2) {
    operator_delete(pcVar1);
  }
  return;
}

Assistant:

~confirm()
    {
        if ( failures > 0 )
        {
            os << failures << " out of " << selected << " selected " << pluralise("test", selected) << " " << colourise( "failed.\n" );
        }
        else if ( output.pass() )
        {
            os << "All " << selected << " selected " << pluralise("test", selected) << " " << colourise( "passed.\n" );
        }
    }